

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl_sdl2.cpp
# Opt level: O0

void ImGui_ImplSDL2_UpdateGamepads(void)

{
  int iVar1;
  int iVar2;
  ImGui_ImplSDL2_Data *pIVar3;
  ImGuiIO *pIVar4;
  ImVector<_SDL_GameController_*> *this;
  SDL_GameControllerButton unaff_retaddr;
  int thumb_dead_zone;
  SDL_GameController *gamepad;
  int n;
  int joystick_count;
  ImGuiIO *io;
  ImGui_ImplSDL2_Data *bd;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  int local_18;
  
  pIVar3 = ImGui_ImplSDL2_GetBackendData();
  pIVar4 = ImGui::GetIO();
  if (((pIVar3->WantUpdateGamepadsList & 1U) != 0) &&
     (pIVar3->GamepadMode != ImGui_ImplSDL2_GamepadMode_Manual)) {
    ImGui_ImplSDL2_CloseGamepads();
    iVar1 = SDL_NumJoysticks();
    local_18 = 0;
    while ((local_18 < iVar1 &&
           (((iVar2 = SDL_IsGameController(local_18), iVar2 == 0 ||
             (this = (ImVector<_SDL_GameController_*> *)SDL_GameControllerOpen(local_18),
             this == (ImVector<_SDL_GameController_*> *)0x0)) ||
            (ImVector<_SDL_GameController_*>::push_back
                       (this,(_SDL_GameController **)
                             CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8)),
            pIVar3->GamepadMode != ImGui_ImplSDL2_GamepadMode_AutoFirst))))) {
      local_18 = local_18 + 1;
    }
    pIVar3->WantUpdateGamepadsList = false;
  }
  if (((pIVar4->ConfigFlags & 2U) != 0) &&
     (pIVar4->BackendFlags = pIVar4->BackendFlags & 0xfffffffe, (pIVar3->Gamepads).Size != 0)) {
    pIVar4->BackendFlags = pIVar4->BackendFlags | 1;
    ImGui_ImplSDL2_UpdateGamepadButton
              ((ImGui_ImplSDL2_Data *)CONCAT44(joystick_count,n),
               (ImGuiIO *)CONCAT44(gamepad._4_4_,gamepad._0_4_),thumb_dead_zone,unaff_retaddr);
    ImGui_ImplSDL2_UpdateGamepadButton
              ((ImGui_ImplSDL2_Data *)CONCAT44(joystick_count,n),
               (ImGuiIO *)CONCAT44(gamepad._4_4_,gamepad._0_4_),thumb_dead_zone,unaff_retaddr);
    ImGui_ImplSDL2_UpdateGamepadButton
              ((ImGui_ImplSDL2_Data *)CONCAT44(joystick_count,n),
               (ImGuiIO *)CONCAT44(gamepad._4_4_,gamepad._0_4_),thumb_dead_zone,unaff_retaddr);
    ImGui_ImplSDL2_UpdateGamepadButton
              ((ImGui_ImplSDL2_Data *)CONCAT44(joystick_count,n),
               (ImGuiIO *)CONCAT44(gamepad._4_4_,gamepad._0_4_),thumb_dead_zone,unaff_retaddr);
    ImGui_ImplSDL2_UpdateGamepadButton
              ((ImGui_ImplSDL2_Data *)CONCAT44(joystick_count,n),
               (ImGuiIO *)CONCAT44(gamepad._4_4_,gamepad._0_4_),thumb_dead_zone,unaff_retaddr);
    ImGui_ImplSDL2_UpdateGamepadButton
              ((ImGui_ImplSDL2_Data *)CONCAT44(joystick_count,n),
               (ImGuiIO *)CONCAT44(gamepad._4_4_,gamepad._0_4_),thumb_dead_zone,unaff_retaddr);
    ImGui_ImplSDL2_UpdateGamepadButton
              ((ImGui_ImplSDL2_Data *)CONCAT44(joystick_count,n),
               (ImGuiIO *)CONCAT44(gamepad._4_4_,gamepad._0_4_),thumb_dead_zone,unaff_retaddr);
    ImGui_ImplSDL2_UpdateGamepadButton
              ((ImGui_ImplSDL2_Data *)CONCAT44(joystick_count,n),
               (ImGuiIO *)CONCAT44(gamepad._4_4_,gamepad._0_4_),thumb_dead_zone,unaff_retaddr);
    ImGui_ImplSDL2_UpdateGamepadButton
              ((ImGui_ImplSDL2_Data *)CONCAT44(joystick_count,n),
               (ImGuiIO *)CONCAT44(gamepad._4_4_,gamepad._0_4_),thumb_dead_zone,unaff_retaddr);
    ImGui_ImplSDL2_UpdateGamepadButton
              ((ImGui_ImplSDL2_Data *)CONCAT44(joystick_count,n),
               (ImGuiIO *)CONCAT44(gamepad._4_4_,gamepad._0_4_),thumb_dead_zone,unaff_retaddr);
    ImGui_ImplSDL2_UpdateGamepadButton
              ((ImGui_ImplSDL2_Data *)CONCAT44(joystick_count,n),
               (ImGuiIO *)CONCAT44(gamepad._4_4_,gamepad._0_4_),thumb_dead_zone,unaff_retaddr);
    ImGui_ImplSDL2_UpdateGamepadButton
              ((ImGui_ImplSDL2_Data *)CONCAT44(joystick_count,n),
               (ImGuiIO *)CONCAT44(gamepad._4_4_,gamepad._0_4_),thumb_dead_zone,unaff_retaddr);
    ImGui_ImplSDL2_UpdateGamepadAnalog(bd,io,joystick_count,n,gamepad._4_4_,gamepad._0_4_);
    ImGui_ImplSDL2_UpdateGamepadAnalog(bd,io,joystick_count,n,gamepad._4_4_,gamepad._0_4_);
    ImGui_ImplSDL2_UpdateGamepadButton
              ((ImGui_ImplSDL2_Data *)CONCAT44(joystick_count,n),
               (ImGuiIO *)CONCAT44(gamepad._4_4_,gamepad._0_4_),thumb_dead_zone,unaff_retaddr);
    ImGui_ImplSDL2_UpdateGamepadButton
              ((ImGui_ImplSDL2_Data *)CONCAT44(joystick_count,n),
               (ImGuiIO *)CONCAT44(gamepad._4_4_,gamepad._0_4_),thumb_dead_zone,unaff_retaddr);
    ImGui_ImplSDL2_UpdateGamepadAnalog(bd,io,joystick_count,n,gamepad._4_4_,gamepad._0_4_);
    ImGui_ImplSDL2_UpdateGamepadAnalog(bd,io,joystick_count,n,gamepad._4_4_,gamepad._0_4_);
    ImGui_ImplSDL2_UpdateGamepadAnalog(bd,io,joystick_count,n,gamepad._4_4_,gamepad._0_4_);
    ImGui_ImplSDL2_UpdateGamepadAnalog(bd,io,joystick_count,n,gamepad._4_4_,gamepad._0_4_);
    ImGui_ImplSDL2_UpdateGamepadAnalog(bd,io,joystick_count,n,gamepad._4_4_,gamepad._0_4_);
    ImGui_ImplSDL2_UpdateGamepadAnalog(bd,io,joystick_count,n,gamepad._4_4_,gamepad._0_4_);
    ImGui_ImplSDL2_UpdateGamepadAnalog(bd,io,joystick_count,n,gamepad._4_4_,gamepad._0_4_);
    ImGui_ImplSDL2_UpdateGamepadAnalog(bd,io,joystick_count,n,gamepad._4_4_,gamepad._0_4_);
  }
  return;
}

Assistant:

static void ImGui_ImplSDL2_UpdateGamepads()
{
    ImGui_ImplSDL2_Data* bd = ImGui_ImplSDL2_GetBackendData();
    ImGuiIO& io = ImGui::GetIO();

    // Update list of controller(s) to use
    if (bd->WantUpdateGamepadsList && bd->GamepadMode != ImGui_ImplSDL2_GamepadMode_Manual)
    {
        ImGui_ImplSDL2_CloseGamepads();
        int joystick_count = SDL_NumJoysticks();
        for (int n = 0; n < joystick_count; n++)
            if (SDL_IsGameController(n))
                if (SDL_GameController* gamepad = SDL_GameControllerOpen(n))
                {
                    bd->Gamepads.push_back(gamepad);
                    if (bd->GamepadMode == ImGui_ImplSDL2_GamepadMode_AutoFirst)
                        break;
                }
        bd->WantUpdateGamepadsList = false;
    }

    // FIXME: Technically feeding gamepad shouldn't depend on this now that they are regular inputs.
    if ((io.ConfigFlags & ImGuiConfigFlags_NavEnableGamepad) == 0)
        return;
    io.BackendFlags &= ~ImGuiBackendFlags_HasGamepad;
    if (bd->Gamepads.Size == 0)
        return;
    io.BackendFlags |= ImGuiBackendFlags_HasGamepad;

    // Update gamepad inputs
    const int thumb_dead_zone = 8000; // SDL_gamecontroller.h suggests using this value.
    ImGui_ImplSDL2_UpdateGamepadButton(bd, io, ImGuiKey_GamepadStart,       SDL_CONTROLLER_BUTTON_START);
    ImGui_ImplSDL2_UpdateGamepadButton(bd, io, ImGuiKey_GamepadBack,        SDL_CONTROLLER_BUTTON_BACK);
    ImGui_ImplSDL2_UpdateGamepadButton(bd, io, ImGuiKey_GamepadFaceLeft,    SDL_CONTROLLER_BUTTON_X);              // Xbox X, PS Square
    ImGui_ImplSDL2_UpdateGamepadButton(bd, io, ImGuiKey_GamepadFaceRight,   SDL_CONTROLLER_BUTTON_B);              // Xbox B, PS Circle
    ImGui_ImplSDL2_UpdateGamepadButton(bd, io, ImGuiKey_GamepadFaceUp,      SDL_CONTROLLER_BUTTON_Y);              // Xbox Y, PS Triangle
    ImGui_ImplSDL2_UpdateGamepadButton(bd, io, ImGuiKey_GamepadFaceDown,    SDL_CONTROLLER_BUTTON_A);              // Xbox A, PS Cross
    ImGui_ImplSDL2_UpdateGamepadButton(bd, io, ImGuiKey_GamepadDpadLeft,    SDL_CONTROLLER_BUTTON_DPAD_LEFT);
    ImGui_ImplSDL2_UpdateGamepadButton(bd, io, ImGuiKey_GamepadDpadRight,   SDL_CONTROLLER_BUTTON_DPAD_RIGHT);
    ImGui_ImplSDL2_UpdateGamepadButton(bd, io, ImGuiKey_GamepadDpadUp,      SDL_CONTROLLER_BUTTON_DPAD_UP);
    ImGui_ImplSDL2_UpdateGamepadButton(bd, io, ImGuiKey_GamepadDpadDown,    SDL_CONTROLLER_BUTTON_DPAD_DOWN);
    ImGui_ImplSDL2_UpdateGamepadButton(bd, io, ImGuiKey_GamepadL1,          SDL_CONTROLLER_BUTTON_LEFTSHOULDER);
    ImGui_ImplSDL2_UpdateGamepadButton(bd, io, ImGuiKey_GamepadR1,          SDL_CONTROLLER_BUTTON_RIGHTSHOULDER);
    ImGui_ImplSDL2_UpdateGamepadAnalog(bd, io, ImGuiKey_GamepadL2,          SDL_CONTROLLER_AXIS_TRIGGERLEFT,  0.0f, 32767);
    ImGui_ImplSDL2_UpdateGamepadAnalog(bd, io, ImGuiKey_GamepadR2,          SDL_CONTROLLER_AXIS_TRIGGERRIGHT, 0.0f, 32767);
    ImGui_ImplSDL2_UpdateGamepadButton(bd, io, ImGuiKey_GamepadL3,          SDL_CONTROLLER_BUTTON_LEFTSTICK);
    ImGui_ImplSDL2_UpdateGamepadButton(bd, io, ImGuiKey_GamepadR3,          SDL_CONTROLLER_BUTTON_RIGHTSTICK);
    ImGui_ImplSDL2_UpdateGamepadAnalog(bd, io, ImGuiKey_GamepadLStickLeft,  SDL_CONTROLLER_AXIS_LEFTX,  -thumb_dead_zone, -32768);
    ImGui_ImplSDL2_UpdateGamepadAnalog(bd, io, ImGuiKey_GamepadLStickRight, SDL_CONTROLLER_AXIS_LEFTX,  +thumb_dead_zone, +32767);
    ImGui_ImplSDL2_UpdateGamepadAnalog(bd, io, ImGuiKey_GamepadLStickUp,    SDL_CONTROLLER_AXIS_LEFTY,  -thumb_dead_zone, -32768);
    ImGui_ImplSDL2_UpdateGamepadAnalog(bd, io, ImGuiKey_GamepadLStickDown,  SDL_CONTROLLER_AXIS_LEFTY,  +thumb_dead_zone, +32767);
    ImGui_ImplSDL2_UpdateGamepadAnalog(bd, io, ImGuiKey_GamepadRStickLeft,  SDL_CONTROLLER_AXIS_RIGHTX, -thumb_dead_zone, -32768);
    ImGui_ImplSDL2_UpdateGamepadAnalog(bd, io, ImGuiKey_GamepadRStickRight, SDL_CONTROLLER_AXIS_RIGHTX, +thumb_dead_zone, +32767);
    ImGui_ImplSDL2_UpdateGamepadAnalog(bd, io, ImGuiKey_GamepadRStickUp,    SDL_CONTROLLER_AXIS_RIGHTY, -thumb_dead_zone, -32768);
    ImGui_ImplSDL2_UpdateGamepadAnalog(bd, io, ImGuiKey_GamepadRStickDown,  SDL_CONTROLLER_AXIS_RIGHTY, +thumb_dead_zone, +32767);
}